

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedPrinter.h
# Opt level: O2

void __thiscall
llvm::DelimitedScope<'{',_'}'>::DelimitedScope
          (DelimitedScope<___,____> *this,ScopedPrinter *W,StringRef N)

{
  raw_ostream *prVar1;
  
  this->W = W;
  prVar1 = ScopedPrinter::startLine(W);
  raw_ostream::operator<<(prVar1,N);
  if (N.Length != 0) {
    raw_ostream::operator<<(W->OS,' ');
  }
  prVar1 = raw_ostream::operator<<(W->OS,'{');
  raw_ostream::operator<<(prVar1,'\n');
  W->IndentLevel = W->IndentLevel + 1;
  return;
}

Assistant:

DelimitedScope(ScopedPrinter &W, StringRef N) : W(W) {
    W.startLine() << N;
    if (!N.empty())
      W.getOStream() << ' ';
    W.getOStream() << Open << '\n';
    W.indent();
  }